

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

void SetLoopParams(VP8Encoder *enc,float q)

{
  VP8Encoder *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_stack_0000002c;
  VP8Encoder *in_stack_00000030;
  VP8Encoder *in_stack_00000040;
  undefined4 in_stack_fffffffffffffff0;
  
  fVar1 = Clamp(in_XMM0_Da,0.0,100.0);
  VP8SetSegmentParams(in_stack_00000030,in_stack_0000002c);
  SetSegmentProbas(in_stack_00000040);
  ResetStats((VP8Encoder *)CONCAT44(fVar1,in_stack_fffffffffffffff0));
  ResetSSE(in_RDI);
  return;
}

Assistant:

static void SetLoopParams(VP8Encoder* const enc, float q) {
  // Make sure the quality parameter is inside valid bounds
  q = Clamp(q, 0.f, 100.f);

  VP8SetSegmentParams(enc, q);      // setup segment quantizations and filters
  SetSegmentProbas(enc);            // compute segment probabilities

  ResetStats(enc);
  ResetSSE(enc);
}